

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O1

void __thiscall
s2coding::EncodeS2PointVector
          (s2coding *this,Span<const_Vector3<double>_> points,CodingHint hint,Encoder *encoder)

{
  undefined7 in_register_00000009;
  Encoder *encoder_00;
  uint uVar1;
  Span<const_Vector3<double>_> points_00;
  Span<const_Vector3<double>_> points_01;
  S2LogMessage local_20;
  
  encoder_00 = (Encoder *)CONCAT71(in_register_00000009,hint);
  points_00.ptr_ = points.ptr_;
  uVar1 = (uint)points.len_;
  if (uVar1 == 1) {
    points_01.len_ = (size_type)points_00.ptr_;
    points_01.ptr_ = (pointer)this;
    EncodeS2PointVectorCompact(points_01,encoder_00);
    return;
  }
  if (uVar1 == 0) {
    points_00.len_ = (size_type)encoder_00;
    EncodeS2PointVectorFast(this,points_00,encoder_00);
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
             ,99,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(local_20.stream_,"Unknown CodingHint: ",0x14);
  std::ostream::operator<<(local_20.stream_,uVar1 & 0xff);
  abort();
}

Assistant:

void EncodeS2PointVector(Span<const S2Point> points, CodingHint hint,
                         Encoder* encoder) {
  switch (hint) {
    case CodingHint::FAST:
      return EncodeS2PointVectorFast(points, encoder);

    case CodingHint::COMPACT:
      return EncodeS2PointVectorCompact(points, encoder);

    default:
      S2_LOG(DFATAL) << "Unknown CodingHint: " << static_cast<int>(hint);
  }
}